

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

void usage(int argc,char **argv)

{
  undefined8 *in_RSI;
  
  fprintf(_stderr,"Usage: %s [OPTIONS] [FILE...]\n",*in_RSI);
  fprintf(_stderr,"Relay and/or record packet stream.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"      --subscribe ADDR    Address to subscribe to\n");
  fprintf(_stderr,"      --publish ADDR      Address to re-publish packets to\n");
  fprintf(_stderr,"      --vcid VCID         Virtual Channel ID to filter\n");
  fprintf(_stderr,"                          (can be specified multiple times)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Record packet stream:\n");
  fprintf(_stderr,"      --record            Enable recording of packet stream to disk\n");
  fprintf(_stderr,"      --filename PATTERN  Filename pattern for packet files (see strftime(3))\n")
  ;
  fprintf(_stderr,"                          (default: ./packets-%%FT%%H:%%M:00.raw)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Other:\n");
  fprintf(_stderr,"      --help     Display this help and exit\n");
  fprintf(_stderr,"      --version  Print version information and exit\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"If an address to subscribe to is specified,\n");
  fprintf(_stderr,"FILE arguments are ignored.\n");
  fprintf(_stderr,"\n");
  exit(0);
}

Assistant:

void usage(int argc, char** argv) {
  fprintf(stderr, "Usage: %s [OPTIONS] [FILE...]\n", argv[0]);
  fprintf(stderr, "Relay and/or record packet stream.\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Options:\n");
  fprintf(stderr, "      --subscribe ADDR    Address to subscribe to\n");
  fprintf(stderr, "      --publish ADDR      Address to re-publish packets to\n");
  fprintf(stderr, "      --vcid VCID         Virtual Channel ID to filter\n");
  fprintf(stderr, "                          (can be specified multiple times)\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Record packet stream:\n");
  fprintf(stderr, "      --record            Enable recording of packet stream to disk\n");
  fprintf(stderr, "      --filename PATTERN  Filename pattern for packet files (see strftime(3))\n");
  fprintf(stderr, "                          (default: ./packets-%%FT%%H:%%M:00.raw)\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Other:\n");
  fprintf(stderr, "      --help     Display this help and exit\n");
  fprintf(stderr, "      --version  Print version information and exit\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "If an address to subscribe to is specified,\n");
  fprintf(stderr, "FILE arguments are ignored.\n");
  fprintf(stderr, "\n");
  exit(0);
}